

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

int __thiscall
NNTreeImpl::compareKeyKid(NNTreeImpl *this,QPDFObjectHandle *key,QPDFObjectHandle *kids,int idx)

{
  QPDF *qpdf;
  bool bVar1;
  int iVar2;
  int iVar3;
  bool local_b1;
  QPDFObjectHandle local_b0;
  QPDFObjectHandle local_a0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  byte local_39;
  QPDFObjectHandle local_38;
  int local_24;
  QPDFObjectHandle *pQStack_20;
  int idx_local;
  QPDFObjectHandle *kids_local;
  QPDFObjectHandle *key_local;
  NNTreeImpl *this_local;
  
  local_24 = idx;
  pQStack_20 = kids;
  kids_local = key;
  key_local = (QPDFObjectHandle *)this;
  bVar1 = QPDFObjectHandle::isArray(kids);
  iVar3 = local_24;
  local_39 = 0;
  local_b1 = false;
  if (bVar1) {
    iVar2 = QPDFObjectHandle::getArrayNItems(pQStack_20);
    local_b1 = false;
    if (iVar3 < iVar2) {
      QPDFObjectHandle::getArrayItem(&local_38,(int)pQStack_20);
      local_39 = 1;
      local_b1 = QPDFObjectHandle::isDictionary(&local_38);
    }
  }
  if ((local_39 & 1) != 0) {
    QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  }
  if (((local_b1 ^ 0xffU) & 1) != 0) {
    QTC::TC("qpdf","NNTree kid is invalid",0);
    qpdf = this->qpdf;
    std::__cxx11::to_string(&local_90,local_24);
    std::operator+(&local_70,"invalid kid at index ",&local_90);
    ::error(qpdf,&this->oh,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  QPDFObjectHandle::QPDFObjectHandle(&local_a0,kids_local);
  QPDFObjectHandle::getArrayItem(&local_b0,(int)pQStack_20);
  iVar3 = withinLimits(this,&local_a0,&local_b0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_b0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_a0);
  return iVar3;
}

Assistant:

int
NNTreeImpl::compareKeyKid(QPDFObjectHandle& key, QPDFObjectHandle& kids, int idx)
{
    if (!(kids.isArray() && (idx < kids.getArrayNItems()) &&
          kids.getArrayItem(idx).isDictionary())) {
        QTC::TC("qpdf", "NNTree kid is invalid");
        error(qpdf, this->oh, "invalid kid at index " + std::to_string(idx));
    }
    return withinLimits(key, kids.getArrayItem(idx));
}